

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CounterUnitTest.cpp
# Opt level: O2

bool TestComparisonsF<Counter<unsigned_char,8u>>(void)

{
  return true;
}

Assistant:

bool TestComparisonsF()
{
    CounterT a = 2, b = 2, c = 3;
    TEST_CHECK(a == b);
    TEST_CHECK(b != c);
    b = c;
    TEST_CHECK(b == c);
    TEST_CHECK(a != b);

    for (unsigned sep = 0; sep < 3; ++sep)
    {
        a = CounterT::kMask - sep;
        b = 0;
        c = 1 + sep;

        for (unsigned ii = 0; ii < 1000; ++ii)
        {
            TEST_CHECK(a == a);
            TEST_CHECK(b == b);
            TEST_CHECK(c == c);
            TEST_CHECK(a != b);
            TEST_CHECK(a != c);
            TEST_CHECK(b != a);
            TEST_CHECK(b != c);
            TEST_CHECK(c != a);
            TEST_CHECK(c != b);

            TEST_CHECK(a < b);
            TEST_CHECK(a < c);
            TEST_CHECK(b < c);
            TEST_CHECK(a <= b);
            TEST_CHECK(a <= c);
            TEST_CHECK(b <= c);
            TEST_CHECK(a <= a);
            TEST_CHECK(b <= b);
            TEST_CHECK(c <= c);

            TEST_CHECK(b > a);
            TEST_CHECK(c > a);
            TEST_CHECK(c > b);
            TEST_CHECK(b >= a);
            TEST_CHECK(c >= a);
            TEST_CHECK(c >= b);
            TEST_CHECK(a >= a);
            TEST_CHECK(b >= b);
            TEST_CHECK(c >= c);

            a++;
            ++b;
            c++;
        }

        for (unsigned ii = 0; ii < 2000; ++ii)
        {
            TEST_CHECK(a == a);
            TEST_CHECK(b == b);
            TEST_CHECK(c == c);
            TEST_CHECK(a != b);
            TEST_CHECK(a != c);
            TEST_CHECK(b != a);
            TEST_CHECK(b != c);
            TEST_CHECK(c != a);
            TEST_CHECK(c != b);

            TEST_CHECK(a < b);
            TEST_CHECK(a < c);
            TEST_CHECK(b < c);
            TEST_CHECK(a <= b);
            TEST_CHECK(a <= c);
            TEST_CHECK(b <= c);
            TEST_CHECK(a <= a);
            TEST_CHECK(b <= b);
            TEST_CHECK(c <= c);

            TEST_CHECK(b > a);
            TEST_CHECK(c > a);
            TEST_CHECK(c > b);
            TEST_CHECK(b >= a);
            TEST_CHECK(c >= a);
            TEST_CHECK(c >= b);
            TEST_CHECK(a >= a);
            TEST_CHECK(b >= b);
            TEST_CHECK(c >= c);

            a--;
            --b;
            c--;
        }
    }

    return true;
}